

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O2

string * tinyusdz::print_typed_attr<int>
                   (string *__return_storage_ptr__,
                   TypedAttributeWithFallback<tinyusdz::Animatable<int>_> *attr,string *name,
                   uint32_t indent)

{
  pointer pPVar1;
  pointer pPVar2;
  Path *v;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  Animatable<int> *v_00;
  ostream *poVar6;
  long lVar7;
  uint32_t uVar8;
  uint32_t n;
  uint32_t n_00;
  uint32_t n_01;
  uint32_t extraout_EDX;
  bool bVar9;
  stringstream ss;
  string local_200;
  string *local_1e0;
  string local_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8 [376];
  
  uVar8 = indent;
  ::std::__cxx11::stringstream::stringstream(local_1b8);
  bVar3 = TypedAttributeWithFallback<tinyusdz::Animatable<int>_>::authored(attr);
  if (bVar3) {
    local_1e0 = __return_storage_ptr__;
    v_00 = TypedAttributeWithFallback<tinyusdz::Animatable<int>_>::get_value(attr);
    pPVar1 = (attr->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    pPVar2 = (attr->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
             _M_impl.super__Vector_impl_data._M_start;
    bVar3 = attr->_empty;
    if ((v_00->_blocked == false) && (v_00->_has_value == false)) {
      bVar9 = (v_00->_ts)._samples.
              super__Vector_base<tinyusdz::TypedTimeSamples<int>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<int>::Sample>_>
              ._M_impl.super__Vector_impl_data._M_start !=
              (v_00->_ts)._samples.
              super__Vector_base<tinyusdz::TypedTimeSamples<int>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<int>::Sample>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    }
    else {
      bVar9 = false;
    }
    bVar4 = TypedAttributeWithFallback<tinyusdz::Animatable<int>_>::is_value_empty(attr);
    bVar5 = AttrMetas::authored(&attr->_metas);
    if (((!bVar5 && !bVar4) & (pPVar1 != pPVar2 & bVar3 | bVar9) & bVar3) == 0) {
      if ((bVar3 & 1U) == 0) {
        pprint::Indent_abi_cxx11_(&local_200,(pprint *)(ulong)indent,n);
        ::std::operator<<(local_1a8,(string *)&local_200);
        ::std::__cxx11::string::_M_dispose();
        value::TypeTraits<int>::type_name_abi_cxx11_();
        poVar6 = ::std::operator<<(local_1a8,(string *)&local_200);
        poVar6 = ::std::operator<<(poVar6," ");
        ::std::operator<<(poVar6,(string *)name);
        ::std::__cxx11::string::_M_dispose();
        poVar6 = ::std::operator<<(local_1a8," = ");
        print_animatable_default<int>(&local_200,v_00,indent);
        ::std::operator<<(poVar6,(string *)&local_200);
      }
      else {
        pprint::Indent_abi_cxx11_(&local_200,(pprint *)(ulong)indent,n);
        ::std::operator<<(local_1a8,(string *)&local_200);
        ::std::__cxx11::string::_M_dispose();
        value::TypeTraits<int>::type_name_abi_cxx11_();
        poVar6 = ::std::operator<<(local_1a8,(string *)&local_200);
        poVar6 = ::std::operator<<(poVar6," ");
        ::std::operator<<(poVar6,(string *)name);
      }
      ::std::__cxx11::string::_M_dispose();
      bVar3 = AttrMetas::authored(&attr->_metas);
      if (bVar3) {
        poVar6 = ::std::operator<<(local_1a8," (\n");
        print_attr_metas_abi_cxx11_
                  (&local_200,(tinyusdz *)attr,(AttrMeta *)(ulong)(indent + 1),uVar8);
        poVar6 = ::std::operator<<(poVar6,(string *)&local_200);
        pprint::Indent_abi_cxx11_(&local_1d8,(pprint *)(ulong)indent,n_00);
        poVar6 = ::std::operator<<(poVar6,(string *)&local_1d8);
        ::std::operator<<(poVar6,")");
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
      }
      ::std::operator<<(local_1a8,"\n");
    }
    bVar3 = Animatable<int>::has_timesamples(v_00);
    uVar8 = n_01;
    if (bVar3) {
      pprint::Indent_abi_cxx11_(&local_200,(pprint *)(ulong)indent,n_01);
      ::std::operator<<(local_1a8,(string *)&local_200);
      ::std::__cxx11::string::_M_dispose();
      value::TypeTraits<int>::type_name_abi_cxx11_();
      poVar6 = ::std::operator<<(local_1a8,(string *)&local_200);
      poVar6 = ::std::operator<<(poVar6," ");
      ::std::operator<<(poVar6,(string *)name);
      ::std::__cxx11::string::_M_dispose();
      poVar6 = ::std::operator<<(local_1a8,".timeSamples = ");
      print_animatable_timesamples<int>(&local_200,v_00,indent);
      ::std::operator<<(poVar6,(string *)&local_200);
      ::std::__cxx11::string::_M_dispose();
      ::std::operator<<(local_1a8,"\n");
      uVar8 = extraout_EDX;
    }
    __return_storage_ptr__ = local_1e0;
    if ((attr->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        (attr->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
        super__Vector_impl_data._M_start) {
      pprint::Indent_abi_cxx11_(&local_200,(pprint *)(ulong)indent,uVar8);
      ::std::operator<<(local_1a8,(string *)&local_200);
      ::std::__cxx11::string::_M_dispose();
      value::TypeTraits<int>::type_name_abi_cxx11_();
      poVar6 = ::std::operator<<(local_1a8,(string *)&local_200);
      poVar6 = ::std::operator<<(poVar6," ");
      ::std::operator<<(poVar6,(string *)name);
      ::std::__cxx11::string::_M_dispose();
      ::std::operator<<(local_1a8,".connect = ");
      v = (attr->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl
          .super__Vector_impl_data._M_start;
      lVar7 = ((long)(attr->_paths).
                     super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)v) / 0xd0;
      if (lVar7 == 0) {
        ::std::operator<<(local_1a8,"[InternalError]");
      }
      else if (lVar7 == 1) {
        ::std::operator<<(local_1a8,v);
      }
      else {
        ::std::operator<<(local_1a8,&attr->_paths);
      }
      ::std::operator<<(local_1a8,"\n");
    }
  }
  ::std::__cxx11::stringbuf::str();
  ::std::__cxx11::stringstream::~stringstream(local_1b8);
  return __return_storage_ptr__;
}

Assistant:

std::string print_typed_attr(
    const TypedAttributeWithFallback<Animatable<T>> &attr,
    const std::string &name, const uint32_t indent) {
  std::stringstream ss;

  if (attr.authored()) {

    const auto &v = attr.get_value();

    bool is_connection = attr.is_connection();
    bool is_timesamples = v.is_timesamples();
    bool has_value = attr.has_value();
    bool is_value_empty = attr.is_value_empty();

    DCOUT("name " << name);
    DCOUT("is_value_empty " << attr.is_value_empty());
    DCOUT("is_connection " << is_connection);
    DCOUT("is_timesamples " << is_timesamples);
    DCOUT("is_value_empty " << is_value_empty);
    DCOUT("has_value " << has_value);

    if (attr.metas().authored() || has_value || is_value_empty || ((!is_connection) && (!is_timesamples))) {
      if (has_value) {
        ss << pprint::Indent(indent);
        ss << value::TypeTraits<T>::type_name() << " " << name;
        ss << " = " << print_animatable_default(v, indent);

      } else { // attr.is_value_empty()
        // declare only
        ss << pprint::Indent(indent);
        ss << value::TypeTraits<T>::type_name() << " " << name;
      }

      if (attr.metas().authored()) {
        ss << " (\n"
           << print_attr_metas(attr.metas(), indent + 1) << pprint::Indent(indent)
           << ")";
      }
      ss << "\n";
    }

    if (v.has_timesamples()) {
      ss << pprint::Indent(indent);
      ss << value::TypeTraits<T>::type_name() << " " << name;
      ss << ".timeSamples = " << print_animatable_timesamples(v, indent);
      ss << "\n";
    }

    if (attr.has_connections()) {
      ss << pprint::Indent(indent);
      ss << value::TypeTraits<T>::type_name() << " " << name;
      ss << ".connect = ";

      const std::vector<Path> &paths = attr.get_connections();
      if (paths.size() == 1) {
        ss << paths[0];
      } else if (paths.size() == 0) {
        ss << "[InternalError]";
      } else {
        ss << paths;
      }

      ss << "\n";
    }

  }

  return ss.str();
}